

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5ExprFirst(Fts5Expr *p,Fts5Index *pIdx,i64 iFirst,int bDesc)

{
  Fts5ExprNode *pNode;
  bool bVar1;
  int iVar2;
  
  pNode = p->pRoot;
  p->pIndex = pIdx;
  p->bDesc = bDesc;
  iVar2 = fts5ExprNodeFirst(p,pNode);
  if (iVar2 != 0) goto LAB_001c9e03;
  iVar2 = 0;
  if (pNode->bEof != 0) goto LAB_001c9e03;
  bVar1 = iFirst < pNode->iRowid;
  if (p->bDesc == 0) {
    bVar1 = pNode->iRowid < iFirst;
  }
  if (!bVar1) goto LAB_001c9e03;
  iVar2 = 1;
  while( true ) {
    iVar2 = (*pNode->xNext)(p,pNode,iVar2,iFirst);
LAB_001c9e03:
    if (pNode->bNomatch == 0) break;
    iVar2 = 0;
    iFirst = 0;
  }
  return iVar2;
}

Assistant:

static int sqlite3Fts5ExprFirst(Fts5Expr *p, Fts5Index *pIdx, i64 iFirst, int bDesc){
  Fts5ExprNode *pRoot = p->pRoot;
  int rc;                         /* Return code */

  p->pIndex = pIdx;
  p->bDesc = bDesc;
  rc = fts5ExprNodeFirst(p, pRoot);

  /* If not at EOF but the current rowid occurs earlier than iFirst in
  ** the iteration order, move to document iFirst or later. */
  if( rc==SQLITE_OK 
   && 0==pRoot->bEof 
   && fts5RowidCmp(p, pRoot->iRowid, iFirst)<0 
  ){
    rc = fts5ExprNodeNext(p, pRoot, 1, iFirst);
  }

  /* If the iterator is not at a real match, skip forward until it is. */
  while( pRoot->bNomatch ){
    assert( pRoot->bEof==0 && rc==SQLITE_OK );
    rc = fts5ExprNodeNext(p, pRoot, 0, 0);
  }
  return rc;
}